

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O2

MtrNode * Mtr_MakeGroup(MtrNode *root,uint low,uint size,uint flags)

{
  uint uVar1;
  MtrNode *pMVar2;
  MtrNode *pMVar3;
  uint uVar4;
  MtrNode **ppMVar5;
  uint uVar6;
  MtrNode *pMVar7;
  MtrNode *pMVar8;
  
  if (size != 0) {
    uVar1 = size + low;
    uVar4 = root->low;
    do {
      pMVar8 = root;
      if (low < uVar4) {
        return (MtrNode *)0x0;
      }
      if (pMVar8->size + uVar4 < uVar1) {
        return (MtrNode *)0x0;
      }
      if (uVar4 == low && pMVar8->size == size) {
        pMVar8->flags = flags;
        return pMVar8;
      }
      if (pMVar8->child == (MtrNode *)0x0) {
        pMVar3 = Mtr_AllocNode();
        if (pMVar3 == (MtrNode *)0x0) {
          return (MtrNode *)0x0;
        }
        pMVar3->low = low;
        pMVar3->size = size;
        pMVar3->flags = flags;
        pMVar3->parent = pMVar8;
        pMVar3->younger = (MtrNode *)0x0;
        pMVar3->child = (MtrNode *)0x0;
        pMVar3->elder = (MtrNode *)0x0;
        pMVar8->child = pMVar3;
        return pMVar3;
      }
      pMVar3 = pMVar8->child;
      pMVar7 = (MtrNode *)0x0;
      while( true ) {
        root = pMVar3;
        if (root == (MtrNode *)0x0) {
          pMVar3 = Mtr_AllocNode();
          if (pMVar3 == (MtrNode *)0x0) {
            return (MtrNode *)0x0;
          }
          pMVar3->low = low;
          pMVar3->size = size;
          pMVar3->flags = flags;
          pMVar3->parent = pMVar8;
          pMVar3->elder = pMVar7;
          pMVar7->younger = pMVar3;
          pMVar3->child = (MtrNode *)0x0;
          pMVar3->younger = (MtrNode *)0x0;
          return pMVar3;
        }
        uVar4 = root->low;
        uVar6 = root->size + uVar4;
        if (low < uVar6) break;
        pMVar3 = root->younger;
        pMVar7 = root;
      }
      if (low < uVar4) {
        if (uVar1 <= uVar4) {
          pMVar3 = Mtr_AllocNode();
          if (pMVar3 == (MtrNode *)0x0) {
            return (MtrNode *)0x0;
          }
          pMVar3->low = low;
          pMVar3->size = size;
          pMVar3->flags = flags;
          pMVar3->child = (MtrNode *)0x0;
          pMVar3->parent = pMVar8;
          pMVar3->elder = pMVar7;
          pMVar3->younger = root;
          root->elder = pMVar3;
          if (pMVar7 == (MtrNode *)0x0) {
            pMVar8->child = pMVar3;
            return pMVar3;
          }
          pMVar7->younger = pMVar3;
          return pMVar3;
        }
        if (uVar1 < uVar6) {
          return (MtrNode *)0x0;
        }
        goto LAB_00645c60;
      }
    } while (uVar1 <= uVar6);
    if (low <= uVar4) {
LAB_00645c60:
      pMVar3 = root;
      do {
        pMVar3 = pMVar3->younger;
        if (pMVar3 == (MtrNode *)0x0) {
          pMVar3 = Mtr_AllocNode();
          if (pMVar3 == (MtrNode *)0x0) {
            return (MtrNode *)0x0;
          }
          pMVar3->low = low;
          pMVar3->size = size;
          pMVar3->flags = flags;
          pMVar3->child = root;
          pMVar3->parent = pMVar8;
          pMVar3->elder = pMVar7;
          pMVar3->younger = (MtrNode *)0x0;
          root->elder = (MtrNode *)0x0;
          ppMVar5 = &pMVar7->younger;
          if (pMVar7 == (MtrNode *)0x0) {
            ppMVar5 = &pMVar8->child;
          }
          *ppMVar5 = pMVar3;
          for (; root != (MtrNode *)0x0; root = root->younger) {
            root->parent = pMVar3;
          }
          return pMVar3;
        }
        uVar4 = pMVar3->size + pMVar3->low;
      } while (uVar4 < uVar1);
      if ((uVar1 - 1 < pMVar3->low || uVar4 <= uVar1) &&
         (pMVar2 = Mtr_AllocNode(), pMVar2 != (MtrNode *)0x0)) {
        pMVar2->low = low;
        pMVar2->size = size;
        pMVar2->flags = flags;
        pMVar2->child = root;
        pMVar2->parent = pMVar8;
        ppMVar5 = &pMVar7->younger;
        if (pMVar7 == (MtrNode *)0x0) {
          ppMVar5 = &pMVar8->child;
        }
        *ppMVar5 = pMVar2;
        pMVar2->elder = pMVar7;
        pMVar8 = pMVar3->younger;
        pMVar2->younger = pMVar8;
        if (pMVar8 != (MtrNode *)0x0) {
          pMVar8->elder = pMVar2;
        }
        pMVar3->younger = (MtrNode *)0x0;
        root->elder = (MtrNode *)0x0;
        for (; root != (MtrNode *)0x0; root = root->younger) {
          root->parent = pMVar2;
        }
        return pMVar2;
      }
    }
  }
  return (MtrNode *)0x0;
}

Assistant:

MtrNode *
Mtr_MakeGroup(
  MtrNode * root /* root of the group tree */,
  unsigned int  low /* lower bound of the group */,
  unsigned int  size /* upper bound of the group */,
  unsigned int  flags /* flags for the new group */)
{
    MtrNode *node,
            *first,
            *last,
            *previous,
            *newn;

    /* Sanity check. */
    if (size == 0)
        return(NULL);

    /* Check whether current group includes new group.  This check is
    ** necessary at the top-level call.  In the subsequent calls it is
    ** redundant. */
    if (low < (unsigned int) root->low ||
        low + size > (unsigned int) (root->low + root->size))
        return(NULL);

    /* Trying to create an existing group has the effect of updating
    ** the flags. */
    if (root->size == size && root->low == low) {
        root->flags = flags;
        return(root);
    }

    /* At this point we know that the new group is properly contained
    ** in the group of root. We have two possible cases here: - root
    ** is a terminal node; - root has children. */

    /* Root has no children: create a new group. */
    if (root->child == NULL) {
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->parent = root;
        newn->elder = newn->younger = newn->child = NULL;
        root->child = newn;
        return(newn);
    }

    /* Root has children: Find all chidren of root that are included
    ** in the new group. If the group of any child entirely contains
    ** the new group, call Mtr_MakeGroup recursively. */
    previous = NULL;
    first = root->child; /* guaranteed to be non-NULL */
    while (first != NULL && low >= (unsigned int) (first->low + first->size)) {
        previous = first;
        first = first->younger;
    }
    if (first == NULL) {
        /* We have scanned the entire list and we need to append a new
        ** child at the end of it.  Previous points to the last child
        ** of root. */
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->parent = root;
        newn->elder = previous;
        previous->younger = newn;
        newn->younger = newn->child = NULL;
        return(newn);
    }
    /* Here first is non-NULL and low < first->low + first->size. */
    if (low >= (unsigned int) first->low &&
        low + size <= (unsigned int) (first->low + first->size)) {
        /* The new group is contained in the group of first. */
        newn = Mtr_MakeGroup(first, low, size, flags);
        return(newn);
    } else if (low + size <= first->low) {
        /* The new group is entirely contained in the gap between
        ** previous and first. */
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->child = NULL;
        newn->parent = root;
        newn->elder = previous;
        newn->younger = first;
        first->elder = newn;
        if (previous != NULL) {
            previous->younger = newn;
        } else {
            root->child = newn;
        }
        return(newn);
    } else if (low < (unsigned int) first->low &&
               low + size < (unsigned int) (first->low + first->size)) {
        /* Trying to cut an existing group: not allowed. */
        return(NULL);
    } else if (low > first->low) {
        /* The new group neither is contained in the group of first
        ** (this was tested above) nor contains it. It is therefore
        ** trying to cut an existing group: not allowed. */
        return(NULL);
    }

    /* First holds the pointer to the first child contained in the new
    ** group. Here low <= first->low and low + size >= first->low +
    ** first->size.  One of the two inequalities is strict. */
    last = first->younger;
    while (last != NULL &&
           (unsigned int) (last->low + last->size) < low + size) {
        last = last->younger;
    }
    if (last == NULL) {
        /* All the chilren of root from first onward become children
        ** of the new group. */
        newn = Mtr_AllocNode();
        if (newn == NULL) return(NULL); /* out of memory */
        newn->low = low;
        newn->size = size;
        newn->flags = flags;
        newn->child = first;
        newn->parent = root;
        newn->elder = previous;
        newn->younger = NULL;
        first->elder = NULL;
        if (previous != NULL) {
            previous->younger = newn;
        } else {
            root->child = newn;
        }
        last = first;
        while (last != NULL) {
            last->parent = newn;
            last = last->younger;
        }
        return(newn);
    }

    /* Here last != NULL and low + size <= last->low + last->size. */
    if (low + size - 1 >= (unsigned int) last->low &&
        low + size < (unsigned int) (last->low + last->size)) {
        /* Trying to cut an existing group: not allowed. */
        return(NULL);
    }

    /* First and last point to the first and last of the children of
    ** root that are included in the new group. Allocate a new node
    ** and make all children of root between first and last chidren of
    ** the new node.  Previous points to the child of root immediately
    ** preceeding first. If it is NULL, then first is the first child
    ** of root. */
    newn = Mtr_AllocNode();
    if (newn == NULL) return(NULL);     /* out of memory */
    newn->low = low;
    newn->size = size;
    newn->flags = flags;
    newn->child = first;
    newn->parent = root;
    if (previous == NULL) {
        root->child = newn;
    } else {
        previous->younger = newn;
    }
    newn->elder = previous;
    newn->younger = last->younger;
    if (last->younger != NULL) {
        last->younger->elder = newn;
    }
    last->younger = NULL;
    first->elder = NULL;
    for (node = first; node != NULL; node = node->younger) {
        node->parent = newn;
    }

    return(newn);

}